

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

string * cmdline::detail::
         lexical_cast_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_false>
         ::cast(string *__return_storage_ptr__,unsigned_long *arg)

{
  ostringstream local_190 [8];
  ostringstream ss;
  unsigned_long *arg_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,*arg);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string cast(const Source &arg)
			{
				std::ostringstream ss;
				ss << arg;
				return ss.str();
			}